

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O0

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendUnfragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  uint value;
  int iVar1;
  int32_t iVar2;
  index_t termLength_00;
  ulong rawTail_00;
  long v;
  int64_t reservedValue;
  long lStack_58;
  int32_t frameOffset;
  int64_t resultingOffset;
  int32_t termLength;
  int32_t termId;
  int64_t termOffset;
  int64_t rawTail;
  index_t alignedLength;
  index_t frameLength;
  on_reserved_value_supplier_t *reservedValueSupplier_local;
  index_t length_local;
  index_t srcOffset_local;
  AtomicBuffer *srcBuffer_local;
  HeaderWriter *header_local;
  TermAppender *this_local;
  
  value = length + 0x20;
  iVar1 = util::BitUtil::align<int>(value,0x20);
  rawTail_00 = getAndAddRawTail(this,iVar1);
  iVar2 = LogBufferDescriptor::termId(rawTail_00);
  termLength_00 = AtomicBuffer::capacity(this->m_termBuffer);
  checkTerm(activeTermId,iVar2);
  lStack_58 = (rawTail_00 & 0xffffffff) + (long)iVar1;
  if (termLength_00 < lStack_58) {
    iVar2 = handleEndOfLogCondition
                      (this->m_termBuffer,rawTail_00 & 0xffffffff,header,termLength_00,iVar2);
    lStack_58 = (long)iVar2;
  }
  else {
    iVar1 = (int)rawTail_00;
    HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(rawTail_00 & 0xffffffff),
                        (ulong)value);
    AtomicBuffer::putBytes(this->m_termBuffer,iVar1 + 0x20,srcBuffer,srcOffset,length);
    v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                  (reservedValueSupplier,this->m_termBuffer,iVar1,value);
    AtomicBuffer::putInt64(this->m_termBuffer,iVar1 + 0x18,v);
    FrameDescriptor::frameLengthOrdered(this->m_termBuffer,iVar1,value);
  }
  return (int32_t)lStack_58;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);
        const std::int64_t rawTail = getAndAddRawTail(alignedLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + alignedLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            const std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);
            header.write(m_termBuffer, frameOffset, frameLength, termId);
            m_termBuffer.putBytes(frameOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
            m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }